

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trmm.cpp
# Opt level: O0

double benchmark<remora::triangular_tag<false,false>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                 (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                  *A,matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                     *B,matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *C)

{
  double *pdVar1;
  matrix<double,_remora::column_major,_remora::cpu_tag> *pmVar2;
  size_type sVar3;
  matrix<double,_remora::row_major,_remora::cpu_tag> *this;
  size_type sVar4;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_RSI;
  matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_RDI;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Timer time;
  size_t i;
  double minTime;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  Timer *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 uVar10;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff48;
  matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff50;
  long local_28;
  double local_20 [2];
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *local_10;
  matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
  *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20[0] = std::numeric_limits<double>::max();
  for (local_28 = 0; local_28 != 10; local_28 = local_28 + 1) {
    Timer::Timer(in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
    remora::
    triangular_prod<remora::triangular_tag<false,false>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    remora::noalias<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
              ((matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    remora::noalias_proxy<remora::matrix<double,remora::row_major,remora::cpu_tag>>::operator+=
              ((noalias_proxy<remora::matrix<double,_remora::row_major,_remora::cpu_tag>_> *)
               in_stack_ffffffffffffff20,
               (matrix_matrix_prod<remora::dense_triangular_proxy<const_double,_remora::column_major,_remora::triangular_tag<false,_false>,_remora::cpu_tag>,_remora::matrix<double,_remora::row_major,_remora::cpu_tag>_>
                *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    in_stack_ffffffffffffff50 =
         (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
          *)Timer::stop(in_stack_ffffffffffffff20);
    pdVar1 = std::min<double>(local_20,(double *)&stack0xffffffffffffff50);
    local_20[0] = *pdVar1;
  }
  pmVar2 = remora::
           matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(local_8);
  sVar3 = remora::matrix<double,_remora::column_major,_remora::cpu_tag>::size1(pmVar2);
  uVar9 = 0x43300000;
  uVar10 = 0x45300000;
  auVar6._8_4_ = (int)(sVar3 >> 0x20);
  auVar6._0_8_ = sVar3;
  auVar6._12_4_ = 0x45300000;
  dVar5 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) * 0.5;
  pmVar2 = remora::
           matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(local_8);
  sVar3 = remora::matrix<double,_remora::column_major,_remora::cpu_tag>::size2(pmVar2);
  auVar7._8_4_ = (int)(sVar3 >> 0x20);
  auVar7._0_8_ = sVar3;
  auVar7._12_4_ = uVar10;
  dVar5 = dVar5 * ((auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(uVar9,(int)sVar3) - 4503599627370496.0));
  this = remora::
         matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
         ::operator()(local_10);
  sVar4 = remora::matrix<double,_remora::row_major,_remora::cpu_tag>::size2(this);
  auVar8._8_4_ = (int)(sVar4 >> 0x20);
  auVar8._0_8_ = sVar4;
  auVar8._12_4_ = uVar10;
  return (((dVar5 * ((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(uVar9,(int)sVar4) - 4503599627370496.0))) / local_20[0]) /
         1024.0) / 1024.0;
}

Assistant:

double benchmark(
	matrix_expression<AMat, cpu_tag> const& A,
	matrix_expression<BMat, cpu_tag> const& B,
	matrix_expression<CMat, cpu_tag> & C
){
	double minTime = std::numeric_limits<double>::max();
	for(std::size_t i = 0; i != 10; ++i){
		Timer time;
		noalias(C) += triangular_prod<Triangular>(A,B);
		minTime = std::min(minTime,time.stop());
	}
	return (0.5*A().size1()*A().size2()*B().size2())/minTime/1024/1024;
}